

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_15::BinaryReaderIR::PushLabel
          (BinaryReaderIR *this,LabelType label_type,ExprList *first,Expr *context)

{
  pointer pLVar1;
  pointer pLVar2;
  ExprList *pEVar3;
  undefined4 uVar4;
  long lVar5;
  ulong uVar6;
  pointer pLVar7;
  pointer pLVar8;
  ulong uVar9;
  pointer pLVar10;
  ulong uVar11;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar1 == (this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pLVar2 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pLVar1 - (long)pLVar2 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    lVar5 = (long)pLVar1 - (long)pLVar2 >> 3;
    uVar9 = lVar5 * -0x5555555555555555;
    uVar6 = 1;
    if (pLVar1 != pLVar2) {
      uVar6 = uVar9;
    }
    uVar11 = uVar6 + uVar9;
    if (0x555555555555554 < uVar11) {
      uVar11 = 0x555555555555555;
    }
    if (CARRY8(uVar6,uVar9)) {
      uVar11 = 0x555555555555555;
    }
    if (uVar11 == 0) {
      pLVar7 = (pointer)0x0;
    }
    else {
      pLVar7 = (pointer)operator_new(uVar11 * 0x18);
    }
    (&pLVar7->label_type)[lVar5 * 2] = label_type;
    (&pLVar7->exprs)[lVar5] = first;
    (&pLVar7->context)[lVar5] = context;
    pLVar10 = pLVar7;
    for (pLVar8 = pLVar2; pLVar1 != pLVar8; pLVar8 = pLVar8 + 1) {
      pLVar10->context = pLVar8->context;
      uVar4 = *(undefined4 *)&pLVar8->field_0x4;
      pEVar3 = pLVar8->exprs;
      pLVar10->label_type = pLVar8->label_type;
      *(undefined4 *)&pLVar10->field_0x4 = uVar4;
      pLVar10->exprs = pEVar3;
      pLVar10 = pLVar10 + 1;
    }
    if (pLVar2 != (pointer)0x0) {
      operator_delete(pLVar2,(long)(this->label_stack_).
                                   super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar2
                     );
    }
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_start = pLVar7;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar10 + 1;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar7 + uVar11;
  }
  else {
    pLVar1->label_type = label_type;
    pLVar1->exprs = first;
    pLVar1->context = context;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar1 + 1;
  }
  return;
}

Assistant:

void BinaryReaderIR::PushLabel(LabelType label_type,
                               ExprList* first,
                               Expr* context) {
  label_stack_.emplace_back(label_type, first, context);
}